

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

bool Process::daemonize(String *logFile)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  __pid_t _Var4;
  char *__file;
  bool bVar5;
  
  __file = String::operator_cast_to_char_(logFile);
  bVar5 = false;
  iVar2 = ::open(__file,0x80041,0x180);
  if (iVar2 != -1) {
    iVar3 = dup2(iVar2,1);
    if (iVar3 == -1) {
      iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                            ,0x496,"dup2(fd, STDOUT_FILENO) != -1");
      if (iVar3 != 0) goto LAB_00105f10;
    }
    iVar3 = dup2(iVar2,2);
    if (iVar3 == -1) {
      iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                            ,0x497,"dup2(fd, STDERR_FILENO) != -1");
      if (iVar3 != 0) goto LAB_00105f10;
    }
    ::close(iVar2);
    _Var4 = fork();
    if (_Var4 == -1) {
      bVar5 = false;
    }
    else {
      if (_Var4 != 0) {
        _exit(0);
      }
      _Var4 = setsid();
      bVar5 = true;
      if (_Var4 == -1) {
        iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                              ,0x4a2,"setsid() != -1");
        if (iVar2 != 0) {
LAB_00105f10:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
    }
  }
  return bVar5;
}

Assistant:

bool Process::daemonize(const String& logFile)
{
  int fd = ::open(logFile, O_CREAT | O_WRONLY |  O_CLOEXEC, S_IRUSR | S_IWUSR);
  if(fd == -1)
    return false;
  VERIFY(dup2(fd, STDOUT_FILENO) != -1);
  VERIFY(dup2(fd, STDERR_FILENO) != -1);
  ::close(fd);

  pid_t childPid = fork();
  if(childPid == -1)
    return false;
  if(childPid != 0)
  {
    exit(0);
    return false;
  }
  VERIFY(setsid() != -1);
  return true;
}